

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O2

void scalar_save(t_gobj *z,_binbuf *b)

{
  _binbuf *b_00;
  t_symbol *ptVar1;
  
  b_00 = binbuf_new();
  canvas_writescalar((t_symbol *)z[1].g_pd,(t_word *)&z[1].g_next,b_00,0);
  ptVar1 = gensym("scalar");
  binbuf_addv(b,"ss",&s__X,ptVar1);
  binbuf_addbinbuf(b,b_00);
  binbuf_addsemi(b);
  binbuf_free(b_00);
  return;
}

Assistant:

static void scalar_save(t_gobj *z, t_binbuf *b)
{
    t_scalar *x = (t_scalar *)z;
    t_binbuf *b2 = binbuf_new();
    t_atom a, *argv;
    int i, argc;
    canvas_writescalar(x->sc_template, x->sc_vec, b2, 0);
    binbuf_addv(b, "ss", &s__X, gensym("scalar"));
    binbuf_addbinbuf(b, b2);
    binbuf_addsemi(b);
    binbuf_free(b2);
}